

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_create_from_json_file(qpdf_data qpdf,char *filename)

{
  anon_class_1_0_00000001 local_41;
  function<void_(_qpdf_data_*)> local_40;
  QPDF_ERROR_CODE local_1c;
  char *pcStack_18;
  QPDF_ERROR_CODE status;
  char *filename_local;
  qpdf_data qpdf_local;
  
  local_1c = 0;
  qpdf->filename = filename;
  pcStack_18 = filename;
  filename_local = (char *)qpdf;
  std::function<void(_qpdf_data*)>::function<qpdf_create_from_json_file::__0,void>
            ((function<void(_qpdf_data*)> *)&local_40,&local_41);
  local_1c = trap_errors(qpdf,&local_40);
  std::function<void_(_qpdf_data_*)>::~function(&local_40);
  return local_1c;
}

Assistant:

QPDF_ERROR_CODE
qpdf_create_from_json_file(qpdf_data qpdf, char const* filename)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = filename;
    status = trap_errors(qpdf, [](qpdf_data q) { q->qpdf->createFromJSON(q->filename); });
    return status;
}